

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O1

void alf_one_blk_fix_chroma
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  pel pVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  uVar6 = ~(-1 << ((byte)sample_bit_depth & 0x1f));
  bVar1 = *src;
  lVar5 = (long)i_src;
  if (bVar1 != src[-2]) {
    uVar3 = (uint)bVar1;
    uVar7 = (int)(((uint)src[-6] + (uint)src[6]) * coef[10] +
                  (uint)bVar1 * coef[0x10] + ((uint)src[-4] + (uint)src[4]) * coef[0xc] +
                  ((uint)src[-2] + (uint)src[2]) * coef[0xe] +
                  ((uint)src[lVar5 + -2] + (uint)src[2]) * coef[8] + (src[lVar5] + uVar3) * coef[6]
                  + (src[lVar5 + 2] + uVar3) * coef[4] + (src[lVar5 * 2] + uVar3) * coef[2] +
                    (src[lVar5 * 3] + uVar3) * *coef + 0x20) >> 6;
    uVar3 = uVar6;
    if ((int)uVar7 < (int)uVar6) {
      uVar3 = uVar7;
    }
    pVar4 = '\0';
    if (-1 < (int)uVar7) {
      pVar4 = (pel)uVar3;
    }
    *dst = pVar4;
  }
  lVar9 = (long)(lcu_width * 2 + -2);
  bVar1 = src[lVar9];
  if (bVar1 != src[lVar9 + 2]) {
    uVar3 = (uint)bVar1;
    uVar7 = (int)(((uint)src[lVar9 + -6] + (uint)src[lVar9 + 6]) * coef[10] +
                  (uint)bVar1 * coef[0x10] +
                  ((uint)src[lVar9 + -4] + (uint)src[lVar9 + 4]) * coef[0xc] +
                  ((uint)src[lVar9 + 2] + (uint)src[lVar9 + -2]) * coef[0xe] +
                  (src[lVar5 + lVar9 + -2] + uVar3) * coef[8] +
                  (src[lVar5 + lVar9] + uVar3) * coef[6] +
                  ((uint)src[lVar5 + lVar9 + 2] + (uint)src[lVar9 + -2]) * coef[4] +
                  (src[lVar5 * 2 + lVar9] + uVar3) * coef[2] +
                  (src[lVar5 * 3 + lVar9] + uVar3) * *coef + 0x20) >> 6;
    uVar3 = uVar6;
    if ((int)uVar7 < (int)uVar6) {
      uVar3 = uVar7;
    }
    pVar4 = '\0';
    if (-1 < (int)uVar7) {
      pVar4 = (pel)uVar3;
    }
    dst[lVar9] = pVar4;
  }
  lVar8 = (long)(i_src * (lcu_height + -1));
  bVar1 = src[lVar8];
  if (bVar1 != src[lVar8 + -2]) {
    uVar3 = (uint)bVar1;
    uVar7 = (int)(((uint)src[lVar8 + -6] + (uint)src[lVar8 + 6]) * coef[10] +
                  (uint)bVar1 * coef[0x10] +
                  ((uint)src[lVar8 + -4] + (uint)src[lVar8 + 4]) * coef[0xc] +
                  (src[(lVar8 + 2) - lVar5] + uVar3) * coef[8] +
                  ((uint)src[lVar8 + -2] + (uint)src[lVar8 + 2]) * coef[0xe] +
                  (src[lVar8 - lVar5] + uVar3) * coef[6] +
                  ((uint)(src + (lVar8 - lVar5))[-2] + (uint)src[lVar8 + 2]) * coef[4] +
                  (src[lVar8 - i_src * 2] + uVar3) * coef[2] +
                  (src[lVar8 - i_src * 3] + uVar3) * *coef + 0x20) >> 6;
    uVar3 = uVar6;
    if ((int)uVar7 < (int)uVar6) {
      uVar3 = uVar7;
    }
    pVar4 = '\0';
    if (-1 < (int)uVar7) {
      pVar4 = (pel)uVar3;
    }
    dst[(lcu_height + -1) * i_dst] = pVar4;
  }
  bVar1 = src[lVar9 + lVar8];
  if (bVar1 != src[lVar9 + lVar8 + 2]) {
    lVar2 = lVar9 + lVar8;
    uVar3 = (uint)bVar1;
    uVar3 = (int)(((uint)src[lVar2 + -6] + (uint)src[lVar2 + 6]) * coef[10] +
                  (uint)bVar1 * coef[0x10] +
                  ((uint)src[lVar2 + -4] + (uint)src[lVar2 + 4]) * coef[0xc] +
                  ((uint)src[(lVar2 + 2) - lVar5] + (uint)src[lVar2 + -2]) * coef[8] +
                  ((uint)src[lVar9 + lVar8 + 2] + (uint)src[lVar2 + -2]) * coef[0xe] +
                  (src[lVar2 - lVar5] + uVar3) * coef[6] +
                  ((src + (lVar2 - lVar5))[-2] + uVar3) * coef[4] +
                  (src[lVar2 - i_src * 2] + uVar3) * coef[2] +
                  (src[lVar2 - i_src * 3] + uVar3) * *coef + 0x20) >> 6;
    if ((int)uVar3 < (int)uVar6) {
      uVar6 = uVar3;
    }
    pVar4 = '\0';
    if (-1 < (int)uVar3) {
      pVar4 = (pel)uVar6;
    }
    (dst + (lcu_height + -1) * i_dst)[lVar9] = pVar4;
  }
  return;
}

Assistant:

static void alf_one_blk_fix_chroma(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;
    int sum;
    int max_pel = (1 << sample_bit_depth) - 1;
    int lastCol = (lcu_width - 1) << 1;

    if (src[0] != src[-2]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[0]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lastCol;
    dst += lastCol;

    if (src[0] != src[2]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[0]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    /* last line */
    src -= lastCol;
    dst -= lastCol;
    src += ((lcu_height - 1) * i_src);
    dst += ((lcu_height - 1) * i_dst);

    if (src[0] != src[-2]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[0] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lastCol;
    dst += lastCol;

    if (src[0] != src[2]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[0] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }
}